

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O3

void __thiscall CppJieba::HMMSegment::HMMSegment(HMMSegment *this,char *filePath)

{
  vector<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
  *this_00;
  pointer *pppuVar1;
  iterator iVar2;
  EmitProbMap *local_40 [2];
  
  (this->super_SegmentBase)._isInited = false;
  (this->super_SegmentBase).super_ISegment._vptr_ISegment = (_func_int **)&PTR__HMMSegment_0011bd10;
  (this->_emitProbB)._M_h._M_buckets = &(this->_emitProbB)._M_h._M_single_bucket;
  (this->_emitProbB)._M_h._M_bucket_count = 1;
  (this->_emitProbB)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_emitProbB)._M_h._M_element_count = 0;
  (this->_emitProbB)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_emitProbB)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_emitProbB)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_emitProbE)._M_h._M_buckets = &(this->_emitProbE)._M_h._M_single_bucket;
  (this->_emitProbE)._M_h._M_bucket_count = 1;
  (this->_emitProbE)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_emitProbE)._M_h._M_element_count = 0;
  (this->_emitProbE)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_emitProbE)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_emitProbE)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_emitProbM)._M_h._M_buckets = &(this->_emitProbM)._M_h._M_single_bucket;
  (this->_emitProbM)._M_h._M_bucket_count = 1;
  (this->_emitProbM)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_emitProbM)._M_h._M_element_count = 0;
  (this->_emitProbM)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_emitProbM)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_emitProbM)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_emitProbS)._M_h._M_buckets = &(this->_emitProbS)._M_h._M_single_bucket;
  (this->_emitProbS)._M_h._M_bucket_count = 1;
  (this->_emitProbS)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_emitProbS)._M_h._M_element_count = 0;
  (this->_emitProbS)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this_00 = &this->_emitProbVec;
  (this->_emitProbVec).
  super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_emitProbVec).
  super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_emitProbS)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_emitProbS)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_emitProbVec).
  super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->_hmmModelPath,filePath,(allocator *)local_40);
  memset(this->_startProb,0,0xa0);
  *(undefined4 *)&(this->super_SegmentBase).field_0x9 = 0x534d4542;
  iVar2._M_current =
       (this->_emitProbVec).
       super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->_emitProbVec).
      super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40[0] = &this->_emitProbB;
    std::
    vector<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*,std::allocator<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>>
    ::
    _M_realloc_insert<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>
              ((vector<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*,std::allocator<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>>
                *)this_00,iVar2,local_40);
    iVar2._M_current =
         (this->_emitProbVec).
         super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = &this->_emitProbB;
    iVar2._M_current =
         (this->_emitProbVec).
         super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->_emitProbVec).
    super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current ==
      (this->_emitProbVec).
      super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40[0] = &this->_emitProbE;
    std::
    vector<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*,std::allocator<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>>
    ::
    _M_realloc_insert<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>
              ((vector<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*,std::allocator<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>>
                *)this_00,iVar2,local_40);
    iVar2._M_current =
         (this->_emitProbVec).
         super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = &this->_emitProbE;
    iVar2._M_current =
         (this->_emitProbVec).
         super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->_emitProbVec).
    super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current ==
      (this->_emitProbVec).
      super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40[0] = &this->_emitProbM;
    std::
    vector<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*,std::allocator<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>>
    ::
    _M_realloc_insert<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>
              ((vector<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*,std::allocator<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>>
                *)this_00,iVar2,local_40);
    iVar2._M_current =
         (this->_emitProbVec).
         super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = &this->_emitProbM;
    iVar2._M_current =
         (this->_emitProbVec).
         super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->_emitProbVec).
    super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current ==
      (this->_emitProbVec).
      super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40[0] = &this->_emitProbS;
    std::
    vector<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*,std::allocator<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>>
    ::
    _M_realloc_insert<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>
              ((vector<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*,std::allocator<std::unordered_map<unsigned_short,double,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,double>>>*>>
                *)this_00,iVar2,local_40);
  }
  else {
    *iVar2._M_current = &this->_emitProbS;
    pppuVar1 = &(this->_emitProbVec).
                super__Vector_base<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppuVar1 = *pppuVar1 + 1;
  }
  return;
}

Assistant:

HMMSegment(const char * const filePath): _hmmModelPath(filePath)
            {
                memset(_startProb, 0, sizeof(_startProb));
                memset(_transProb, 0, sizeof(_transProb));
                _statMap[0] = 'B';
                _statMap[1] = 'E';
                _statMap[2] = 'M';
                _statMap[3] = 'S';
                _emitProbVec.push_back(&_emitProbB);
                _emitProbVec.push_back(&_emitProbE);
                _emitProbVec.push_back(&_emitProbM);
                _emitProbVec.push_back(&_emitProbS);
            }